

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

bool __thiscall jsonnet::internal::SortImports::groupEndsAfter(SortImports *this,Local *local)

{
  bool bVar1;
  Local *pLVar2;
  iterator __lhs;
  SortImports *in_RSI;
  FodderElement *fodderElem;
  iterator __end2;
  iterator __begin2;
  Fodder *__range2;
  bool newlineReached;
  Local *next;
  reference in_stack_ffffffffffffffb8;
  __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_38;
  Fodder *local_30;
  byte local_21;
  AST *in_stack_ffffffffffffffe0;
  bool local_1;
  
  pLVar2 = goodLocalOrNull(in_RSI,in_stack_ffffffffffffffe0);
  if (pLVar2 == (Local *)0x0) {
    local_1 = true;
  }
  else {
    local_21 = 0;
    local_30 = internal::open_fodder((AST *)0x2bceca);
    local_38._M_current =
         (FodderElement *)
         std::
         vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         ::begin((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_ffffffffffffffb8);
    __lhs = std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::end((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                               *)__lhs._M_current,
                              (__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                               *)in_stack_ffffffffffffffb8), bVar1) {
      in_stack_ffffffffffffffb8 =
           __gnu_cxx::
           __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
           ::operator*(&local_38);
      if (((local_21 & 1) != 0) || (in_stack_ffffffffffffffb8->blanks != 0)) {
        return true;
      }
      if (in_stack_ffffffffffffffb8->kind != INTERSTITIAL) {
        local_21 = 1;
      }
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
      ::operator++(&local_38);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool groupEndsAfter(Local *local)
    {
        Local *next = goodLocalOrNull(local->body);
        if (!next) {
            return true;
        }

        bool newlineReached = false;
        for (const auto &fodderElem : open_fodder(next)) {
            if (newlineReached || fodderElem.blanks > 0) {
                return true;
            }
            if (fodderElem.kind != FodderElement::Kind::INTERSTITIAL) {
                newlineReached = true;
            }
        }
        return false;
    }